

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

int SoapySDRDevice_setFrequencyCorrection
              (SoapySDRDevice *device,int direction,size_t channel,double value)

{
  undefined1 *puVar1;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *(undefined4 *)(puVar1 + 0x400) = 0;
  *puVar1 = 0;
  (**(code **)(*(long *)device + 0x158))(value,device,direction,channel);
  return 0;
}

Assistant:

int SoapySDRDevice_setFrequencyCorrection(SoapySDRDevice *device, const int direction, const size_t channel, const double value)
{
    __SOAPY_SDR_C_TRY
    device->setFrequencyCorrection(direction, channel, value);
    __SOAPY_SDR_C_CATCH
}